

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O2

void __thiscall TNT::i_refvec<double>::i_refvec(i_refvec<double> *this,int n)

{
  double *pdVar1;
  int *piVar2;
  
  this->data_ = (double *)0x0;
  this->ref_count_ = (int *)0x0;
  if (0 < n) {
    pdVar1 = (double *)operator_new__((ulong)(uint)n << 3);
    this->data_ = pdVar1;
    piVar2 = (int *)operator_new(4);
    this->ref_count_ = piVar2;
    *piVar2 = 1;
  }
  return;
}

Assistant:

i_refvec<T>::i_refvec(int n) : data_(NULL), ref_count_(NULL)
{
	if (n >= 1)
	{
#ifdef TNT_DEBUG
		std::cout  << "new data storage.\n";
#endif
		data_ = new T[n];
		ref_count_ = new int;
		*ref_count_ = 1;
	}
}